

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

bool ON_wString::EqualPath(wchar_t *path1,int element_count1,wchar_t *path2,int element_count2)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  wchar_t null_terminator;
  
  bVar1 = path2 == (wchar_t *)0x0;
  if ((path1 != (wchar_t *)0x0 || element_count1 == 0) &&
     (bVar1 = path1 == (wchar_t *)0x0, path2 != (wchar_t *)0x0 || element_count2 == 0)) {
    null_terminator = L'\0';
    if (element_count1 < 0) {
      element_count1 = Length(path1);
    }
    if (element_count2 < 0) {
      element_count2 = Length(path2);
    }
    if (element_count1 == 0) {
      path1 = &null_terminator;
    }
    if (element_count2 == 0) {
      path2 = &null_terminator;
    }
    bVar1 = true;
    if (element_count1 != element_count2 || path1 != path2) {
      iVar6 = element_count2;
      if (element_count1 < element_count2) {
        iVar6 = element_count1;
      }
      iVar4 = 0;
      iVar7 = 0;
      if (0 < iVar6) {
        iVar4 = iVar6;
        iVar7 = iVar6;
      }
      while (iVar4 != 0) {
        uVar2 = OrdinalUTF32ToIgnoreCase(*path1);
        uVar8 = 0x2f;
        if (uVar2 != 0x5c) {
          uVar8 = uVar2;
        }
        uVar3 = OrdinalUTF32ToIgnoreCase(*path2);
        uVar2 = 0x2f;
        if (uVar3 != 0x5c) {
          uVar2 = uVar3;
        }
        if (uVar8 != uVar2) {
          return false;
        }
        path2 = path2 + 1;
        path1 = path1 + 1;
        iVar4 = iVar4 + -1;
      }
      lVar5 = 0;
      iVar6 = 0;
      if (0 < element_count1) {
        iVar6 = element_count1;
      }
      for (; iVar7 + (int)lVar5 < element_count1; lVar5 = lVar5 + 1) {
        if (path1[lVar5] != L'\0') {
          return false;
        }
      }
      for (lVar5 = 0;
          (iVar4 = iVar6 + (int)lVar5, bVar1 = element_count2 <= iVar4, iVar4 < element_count2 &&
          (path2[lVar5] == L'\0')); lVar5 = lVar5 + 1) {
      }
    }
  }
  return bVar1;
}

Assistant:

bool ON_wString::EqualPath(
  const wchar_t* path1,
  int element_count1,
  const wchar_t* path2,
  int element_count2
  )
{
  WIDE_STRING_EQUAL_PREAMBLE(path1,element_count1,path2,element_count2);

  unsigned int c1=0, c2=0;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;
  int i;
  const bool bOrdinalIgnoreCase = ON_FileSystemPath::PlatformPathIgnoreCase();

  if (bOrdinalIgnoreCase)
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeWideCharPathSepartor((wchar_t)OrdinalWideCharToIgnoreCase(*path1++));
      c2 = ON_NormalizeWideCharPathSepartor((wchar_t)OrdinalWideCharToIgnoreCase(*path2++));
      if ( c1 != c2 )
        return false;
    }
  }
  else
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeWideCharPathSepartor(*path1++);
      c2 = ON_NormalizeWideCharPathSepartor(*path2++);
      if ( c1 != c2 )
        return false;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*path1++))
      return false;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*path2++))
      return false;
  }

  return true;
}